

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unix_address.cpp
# Opt level: O1

result<sockpp::unix_address> *
sockpp::unix_address::create(result<sockpp::unix_address> *__return_storage_ptr__,string *path)

{
  unix_address *puVar1;
  char cVar2;
  char cVar3;
  char cVar4;
  char cVar5;
  char cVar6;
  char cVar7;
  error_category *peVar8;
  long lVar9;
  sockaddr_un *psVar10;
  sockaddr_un *psVar11;
  byte bVar12;
  unix_address local_80;
  
  bVar12 = 0;
  if (path->_M_string_length < 0x6d) {
    unix_address(&local_80,path);
    (__return_storage_ptr__->val_).super_sock_address._vptr_sock_address =
         (_func_int **)&PTR__sock_address_0010ccf0;
    psVar10 = &local_80.addr_;
    psVar11 = &(__return_storage_ptr__->val_).addr_;
    for (lVar9 = 0xd; lVar9 != 0; lVar9 = lVar9 + -1) {
      cVar2 = psVar10->sun_path[0];
      cVar3 = psVar10->sun_path[1];
      cVar4 = psVar10->sun_path[2];
      cVar5 = psVar10->sun_path[3];
      cVar6 = psVar10->sun_path[4];
      cVar7 = psVar10->sun_path[5];
      psVar11->sun_family = psVar10->sun_family;
      psVar11->sun_path[0] = cVar2;
      psVar11->sun_path[1] = cVar3;
      psVar11->sun_path[2] = cVar4;
      psVar11->sun_path[3] = cVar5;
      psVar11->sun_path[4] = cVar6;
      psVar11->sun_path[5] = cVar7;
      psVar10 = (sockaddr_un *)((long)psVar10 + ((ulong)bVar12 * -2 + 1) * 8);
      psVar11 = (sockaddr_un *)((long)psVar11 + (ulong)bVar12 * -0x10 + 8);
    }
    *(undefined4 *)((__return_storage_ptr__->val_).addr_.sun_path + 0x66) =
         local_80.addr_.sun_path._102_4_;
    *(undefined2 *)((__return_storage_ptr__->val_).addr_.sun_path + 0x6a) =
         local_80.addr_.sun_path._106_2_;
    (__return_storage_ptr__->err_)._M_value = 0;
    peVar8 = (error_category *)std::_V2::system_category();
  }
  else {
    (__return_storage_ptr__->val_).super_sock_address._vptr_sock_address = (_func_int **)0x0;
    (__return_storage_ptr__->val_).addr_.sun_family = 0;
    (__return_storage_ptr__->val_).addr_.sun_path[0] = '\0';
    (__return_storage_ptr__->val_).addr_.sun_path[1] = '\0';
    (__return_storage_ptr__->val_).addr_.sun_path[2] = '\0';
    (__return_storage_ptr__->val_).addr_.sun_path[3] = '\0';
    (__return_storage_ptr__->val_).addr_.sun_path[4] = '\0';
    (__return_storage_ptr__->val_).addr_.sun_path[5] = '\0';
    puVar1 = &__return_storage_ptr__->val_;
    (puVar1->addr_).sun_path[6] = '\0';
    (puVar1->addr_).sun_path[7] = '\0';
    (puVar1->addr_).sun_path[8] = '\0';
    (puVar1->addr_).sun_path[9] = '\0';
    (puVar1->addr_).sun_path[10] = '\0';
    (puVar1->addr_).sun_path[0xb] = '\0';
    (puVar1->addr_).sun_path[0xc] = '\0';
    (puVar1->addr_).sun_path[0xd] = '\0';
    puVar1 = &__return_storage_ptr__->val_;
    (puVar1->addr_).sun_path[0xe] = '\0';
    (puVar1->addr_).sun_path[0xf] = '\0';
    (puVar1->addr_).sun_path[0x10] = '\0';
    (puVar1->addr_).sun_path[0x11] = '\0';
    (puVar1->addr_).sun_path[0x12] = '\0';
    (puVar1->addr_).sun_path[0x13] = '\0';
    (puVar1->addr_).sun_path[0x14] = '\0';
    (puVar1->addr_).sun_path[0x15] = '\0';
    puVar1 = &__return_storage_ptr__->val_;
    (puVar1->addr_).sun_path[0x16] = '\0';
    (puVar1->addr_).sun_path[0x17] = '\0';
    (puVar1->addr_).sun_path[0x18] = '\0';
    (puVar1->addr_).sun_path[0x19] = '\0';
    (puVar1->addr_).sun_path[0x1a] = '\0';
    (puVar1->addr_).sun_path[0x1b] = '\0';
    (puVar1->addr_).sun_path[0x1c] = '\0';
    (puVar1->addr_).sun_path[0x1d] = '\0';
    puVar1 = &__return_storage_ptr__->val_;
    (puVar1->addr_).sun_path[0x1e] = '\0';
    (puVar1->addr_).sun_path[0x1f] = '\0';
    (puVar1->addr_).sun_path[0x20] = '\0';
    (puVar1->addr_).sun_path[0x21] = '\0';
    (puVar1->addr_).sun_path[0x22] = '\0';
    (puVar1->addr_).sun_path[0x23] = '\0';
    (puVar1->addr_).sun_path[0x24] = '\0';
    (puVar1->addr_).sun_path[0x25] = '\0';
    puVar1 = &__return_storage_ptr__->val_;
    (puVar1->addr_).sun_path[0x26] = '\0';
    (puVar1->addr_).sun_path[0x27] = '\0';
    (puVar1->addr_).sun_path[0x28] = '\0';
    (puVar1->addr_).sun_path[0x29] = '\0';
    (puVar1->addr_).sun_path[0x2a] = '\0';
    (puVar1->addr_).sun_path[0x2b] = '\0';
    (puVar1->addr_).sun_path[0x2c] = '\0';
    (puVar1->addr_).sun_path[0x2d] = '\0';
    puVar1 = &__return_storage_ptr__->val_;
    (puVar1->addr_).sun_path[0x2e] = '\0';
    (puVar1->addr_).sun_path[0x2f] = '\0';
    (puVar1->addr_).sun_path[0x30] = '\0';
    (puVar1->addr_).sun_path[0x31] = '\0';
    (puVar1->addr_).sun_path[0x32] = '\0';
    (puVar1->addr_).sun_path[0x33] = '\0';
    (puVar1->addr_).sun_path[0x34] = '\0';
    (puVar1->addr_).sun_path[0x35] = '\0';
    puVar1 = &__return_storage_ptr__->val_;
    (puVar1->addr_).sun_path[0x36] = '\0';
    (puVar1->addr_).sun_path[0x37] = '\0';
    (puVar1->addr_).sun_path[0x38] = '\0';
    (puVar1->addr_).sun_path[0x39] = '\0';
    (puVar1->addr_).sun_path[0x3a] = '\0';
    (puVar1->addr_).sun_path[0x3b] = '\0';
    (puVar1->addr_).sun_path[0x3c] = '\0';
    (puVar1->addr_).sun_path[0x3d] = '\0';
    puVar1 = &__return_storage_ptr__->val_;
    (puVar1->addr_).sun_path[0x3e] = '\0';
    (puVar1->addr_).sun_path[0x3f] = '\0';
    (puVar1->addr_).sun_path[0x40] = '\0';
    (puVar1->addr_).sun_path[0x41] = '\0';
    (puVar1->addr_).sun_path[0x42] = '\0';
    (puVar1->addr_).sun_path[0x43] = '\0';
    (puVar1->addr_).sun_path[0x44] = '\0';
    (puVar1->addr_).sun_path[0x45] = '\0';
    puVar1 = &__return_storage_ptr__->val_;
    (puVar1->addr_).sun_path[0x46] = '\0';
    (puVar1->addr_).sun_path[0x47] = '\0';
    (puVar1->addr_).sun_path[0x48] = '\0';
    (puVar1->addr_).sun_path[0x49] = '\0';
    (puVar1->addr_).sun_path[0x4a] = '\0';
    (puVar1->addr_).sun_path[0x4b] = '\0';
    (puVar1->addr_).sun_path[0x4c] = '\0';
    (puVar1->addr_).sun_path[0x4d] = '\0';
    puVar1 = &__return_storage_ptr__->val_;
    (puVar1->addr_).sun_path[0x4e] = '\0';
    (puVar1->addr_).sun_path[0x4f] = '\0';
    (puVar1->addr_).sun_path[0x50] = '\0';
    (puVar1->addr_).sun_path[0x51] = '\0';
    (puVar1->addr_).sun_path[0x52] = '\0';
    (puVar1->addr_).sun_path[0x53] = '\0';
    (puVar1->addr_).sun_path[0x54] = '\0';
    (puVar1->addr_).sun_path[0x55] = '\0';
    puVar1 = &__return_storage_ptr__->val_;
    (puVar1->addr_).sun_path[0x56] = '\0';
    (puVar1->addr_).sun_path[0x57] = '\0';
    (puVar1->addr_).sun_path[0x58] = '\0';
    (puVar1->addr_).sun_path[0x59] = '\0';
    (puVar1->addr_).sun_path[0x5a] = '\0';
    (puVar1->addr_).sun_path[0x5b] = '\0';
    (puVar1->addr_).sun_path[0x5c] = '\0';
    (puVar1->addr_).sun_path[0x5d] = '\0';
    puVar1 = &__return_storage_ptr__->val_;
    (puVar1->addr_).sun_path[0x5e] = '\0';
    (puVar1->addr_).sun_path[0x5f] = '\0';
    (puVar1->addr_).sun_path[0x60] = '\0';
    (puVar1->addr_).sun_path[0x61] = '\0';
    (puVar1->addr_).sun_path[0x62] = '\0';
    (puVar1->addr_).sun_path[99] = '\0';
    (puVar1->addr_).sun_path[100] = '\0';
    (puVar1->addr_).sun_path[0x65] = '\0';
    *(undefined8 *)((__return_storage_ptr__->val_).addr_.sun_path + 0x66) = 0;
    (__return_storage_ptr__->val_).super_sock_address._vptr_sock_address =
         (_func_int **)&PTR__sock_address_0010ccf0;
    (__return_storage_ptr__->val_).addr_.sun_family = 0;
    (__return_storage_ptr__->val_).addr_.sun_path[0] = '\0';
    (__return_storage_ptr__->val_).addr_.sun_path[1] = '\0';
    (__return_storage_ptr__->val_).addr_.sun_path[2] = '\0';
    (__return_storage_ptr__->val_).addr_.sun_path[3] = '\0';
    (__return_storage_ptr__->val_).addr_.sun_path[4] = '\0';
    (__return_storage_ptr__->val_).addr_.sun_path[5] = '\0';
    puVar1 = &__return_storage_ptr__->val_;
    (puVar1->addr_).sun_path[6] = '\0';
    (puVar1->addr_).sun_path[7] = '\0';
    (puVar1->addr_).sun_path[8] = '\0';
    (puVar1->addr_).sun_path[9] = '\0';
    (puVar1->addr_).sun_path[10] = '\0';
    (puVar1->addr_).sun_path[0xb] = '\0';
    (puVar1->addr_).sun_path[0xc] = '\0';
    (puVar1->addr_).sun_path[0xd] = '\0';
    puVar1 = &__return_storage_ptr__->val_;
    (puVar1->addr_).sun_path[0xe] = '\0';
    (puVar1->addr_).sun_path[0xf] = '\0';
    (puVar1->addr_).sun_path[0x10] = '\0';
    (puVar1->addr_).sun_path[0x11] = '\0';
    (puVar1->addr_).sun_path[0x12] = '\0';
    (puVar1->addr_).sun_path[0x13] = '\0';
    (puVar1->addr_).sun_path[0x14] = '\0';
    (puVar1->addr_).sun_path[0x15] = '\0';
    puVar1 = &__return_storage_ptr__->val_;
    (puVar1->addr_).sun_path[0x16] = '\0';
    (puVar1->addr_).sun_path[0x17] = '\0';
    (puVar1->addr_).sun_path[0x18] = '\0';
    (puVar1->addr_).sun_path[0x19] = '\0';
    (puVar1->addr_).sun_path[0x1a] = '\0';
    (puVar1->addr_).sun_path[0x1b] = '\0';
    (puVar1->addr_).sun_path[0x1c] = '\0';
    (puVar1->addr_).sun_path[0x1d] = '\0';
    puVar1 = &__return_storage_ptr__->val_;
    (puVar1->addr_).sun_path[0x1e] = '\0';
    (puVar1->addr_).sun_path[0x1f] = '\0';
    (puVar1->addr_).sun_path[0x20] = '\0';
    (puVar1->addr_).sun_path[0x21] = '\0';
    (puVar1->addr_).sun_path[0x22] = '\0';
    (puVar1->addr_).sun_path[0x23] = '\0';
    (puVar1->addr_).sun_path[0x24] = '\0';
    (puVar1->addr_).sun_path[0x25] = '\0';
    puVar1 = &__return_storage_ptr__->val_;
    (puVar1->addr_).sun_path[0x26] = '\0';
    (puVar1->addr_).sun_path[0x27] = '\0';
    (puVar1->addr_).sun_path[0x28] = '\0';
    (puVar1->addr_).sun_path[0x29] = '\0';
    (puVar1->addr_).sun_path[0x2a] = '\0';
    (puVar1->addr_).sun_path[0x2b] = '\0';
    (puVar1->addr_).sun_path[0x2c] = '\0';
    (puVar1->addr_).sun_path[0x2d] = '\0';
    puVar1 = &__return_storage_ptr__->val_;
    (puVar1->addr_).sun_path[0x2e] = '\0';
    (puVar1->addr_).sun_path[0x2f] = '\0';
    (puVar1->addr_).sun_path[0x30] = '\0';
    (puVar1->addr_).sun_path[0x31] = '\0';
    (puVar1->addr_).sun_path[0x32] = '\0';
    (puVar1->addr_).sun_path[0x33] = '\0';
    (puVar1->addr_).sun_path[0x34] = '\0';
    (puVar1->addr_).sun_path[0x35] = '\0';
    puVar1 = &__return_storage_ptr__->val_;
    (puVar1->addr_).sun_path[0x36] = '\0';
    (puVar1->addr_).sun_path[0x37] = '\0';
    (puVar1->addr_).sun_path[0x38] = '\0';
    (puVar1->addr_).sun_path[0x39] = '\0';
    (puVar1->addr_).sun_path[0x3a] = '\0';
    (puVar1->addr_).sun_path[0x3b] = '\0';
    (puVar1->addr_).sun_path[0x3c] = '\0';
    (puVar1->addr_).sun_path[0x3d] = '\0';
    puVar1 = &__return_storage_ptr__->val_;
    (puVar1->addr_).sun_path[0x3e] = '\0';
    (puVar1->addr_).sun_path[0x3f] = '\0';
    (puVar1->addr_).sun_path[0x40] = '\0';
    (puVar1->addr_).sun_path[0x41] = '\0';
    (puVar1->addr_).sun_path[0x42] = '\0';
    (puVar1->addr_).sun_path[0x43] = '\0';
    (puVar1->addr_).sun_path[0x44] = '\0';
    (puVar1->addr_).sun_path[0x45] = '\0';
    puVar1 = &__return_storage_ptr__->val_;
    (puVar1->addr_).sun_path[0x46] = '\0';
    (puVar1->addr_).sun_path[0x47] = '\0';
    (puVar1->addr_).sun_path[0x48] = '\0';
    (puVar1->addr_).sun_path[0x49] = '\0';
    (puVar1->addr_).sun_path[0x4a] = '\0';
    (puVar1->addr_).sun_path[0x4b] = '\0';
    (puVar1->addr_).sun_path[0x4c] = '\0';
    (puVar1->addr_).sun_path[0x4d] = '\0';
    puVar1 = &__return_storage_ptr__->val_;
    (puVar1->addr_).sun_path[0x4e] = '\0';
    (puVar1->addr_).sun_path[0x4f] = '\0';
    (puVar1->addr_).sun_path[0x50] = '\0';
    (puVar1->addr_).sun_path[0x51] = '\0';
    (puVar1->addr_).sun_path[0x52] = '\0';
    (puVar1->addr_).sun_path[0x53] = '\0';
    (puVar1->addr_).sun_path[0x54] = '\0';
    (puVar1->addr_).sun_path[0x55] = '\0';
    puVar1 = &__return_storage_ptr__->val_;
    (puVar1->addr_).sun_path[0x56] = '\0';
    (puVar1->addr_).sun_path[0x57] = '\0';
    (puVar1->addr_).sun_path[0x58] = '\0';
    (puVar1->addr_).sun_path[0x59] = '\0';
    (puVar1->addr_).sun_path[0x5a] = '\0';
    (puVar1->addr_).sun_path[0x5b] = '\0';
    (puVar1->addr_).sun_path[0x5c] = '\0';
    (puVar1->addr_).sun_path[0x5d] = '\0';
    puVar1 = &__return_storage_ptr__->val_;
    (puVar1->addr_).sun_path[0x5c] = '\0';
    (puVar1->addr_).sun_path[0x5d] = '\0';
    (puVar1->addr_).sun_path[0x5e] = '\0';
    (puVar1->addr_).sun_path[0x5f] = '\0';
    (puVar1->addr_).sun_path[0x60] = '\0';
    (puVar1->addr_).sun_path[0x61] = '\0';
    (puVar1->addr_).sun_path[0x62] = '\0';
    (puVar1->addr_).sun_path[99] = '\0';
    puVar1 = &__return_storage_ptr__->val_;
    (puVar1->addr_).sun_path[100] = '\0';
    (puVar1->addr_).sun_path[0x65] = '\0';
    (puVar1->addr_).sun_path[0x66] = '\0';
    (puVar1->addr_).sun_path[0x67] = '\0';
    (puVar1->addr_).sun_path[0x68] = '\0';
    (puVar1->addr_).sun_path[0x69] = '\0';
    (puVar1->addr_).sun_path[0x6a] = '\0';
    (puVar1->addr_).sun_path[0x6b] = '\0';
    peVar8 = (error_category *)std::_V2::generic_category();
    (__return_storage_ptr__->err_)._M_value = 0x16;
  }
  (__return_storage_ptr__->err_)._M_cat = peVar8;
  return __return_storage_ptr__;
}

Assistant:

result<unix_address> unix_address::create(const string& path) {
    if (path.length() > MAX_PATH_NAME)
        return errc::invalid_argument;

    return unix_address{path};
}